

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall
kj::_::ExclusiveJoinPromiseNode::ExclusiveJoinPromiseNode
          (ExclusiveJoinPromiseNode *this,OwnPromiseNode *left,OwnPromiseNode *right,
          SourceLocation location)

{
  PromiseArenaMember *local_28;
  PromiseArenaMember *local_20;
  
  (this->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x0;
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR_destroy_0061fef0;
  local_20 = &left->ptr->super_PromiseArenaMember;
  left->ptr = (PromiseNode *)0x0;
  Branch::Branch(&this->left,this,(PromiseNode *)&local_20,location);
  if (local_20 != (PromiseArenaMember *)0x0) {
    PromiseDisposer::dispose(local_20);
  }
  local_28 = &right->ptr->super_PromiseArenaMember;
  right->ptr = (PromiseNode *)0x0;
  Branch::Branch(&this->right,this,(PromiseNode *)&local_28,location);
  if (local_28 != (PromiseArenaMember *)0x0) {
    PromiseDisposer::dispose(local_28);
  }
  (this->onReadyEvent).event = (Event *)0x0;
  return;
}

Assistant:

ExclusiveJoinPromiseNode::ExclusiveJoinPromiseNode(
    OwnPromiseNode left, OwnPromiseNode right, SourceLocation location)
    : left(*this, kj::mv(left), location), right(*this, kj::mv(right), location) {}